

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

int32_t unorm2_normalize_63(UNormalizer2 *norm2,UChar *src,int32_t length,UChar *dest,
                           int32_t capacity,UErrorCode *pErrorCode)

{
  int iVar1;
  int32_t iVar2;
  long *plVar3;
  UChar *pUVar4;
  ReorderingBuffer buffer;
  UnicodeString destString;
  Char16Ptr local_e0;
  ConstChar16Ptr local_d8;
  UChar *local_d0;
  UChar *local_c0;
  undefined1 local_b0 [64];
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (src == (UChar *)0x0) {
    if (length != 0) goto LAB_002a33d3;
  }
  else if (length < -1) goto LAB_002a33d3;
  if (dest == (UChar *)0x0) {
    if (capacity != 0) goto LAB_002a33d3;
  }
  else if (capacity < 0) goto LAB_002a33d3;
  if (src == (UChar *)0x0 || src != dest) {
    icu_63::UnicodeString::UnicodeString(&local_70,dest,0,capacity);
    if (length != 0) {
      if ((norm2 == (UNormalizer2 *)0x0) ||
         (plVar3 = (long *)__dynamic_cast(norm2,&icu_63::Normalizer2::typeinfo,
                                          &icu_63::Normalizer2WithImpl::typeinfo,0),
         plVar3 == (long *)0x0)) {
        local_d8.p_ = src;
        icu_63::UnicodeString::UnicodeString
                  ((UnicodeString *)local_b0,(byte)((uint)length >> 0x1f),&local_d8,length);
        local_c0 = local_d8.p_;
        (**(code **)(*(long *)norm2 + 0x18))(norm2,local_b0,&local_70,pErrorCode);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
      }
      else {
        local_b0._0_8_ = plVar3[1];
        local_b0._8_8_ = &local_70;
        local_b0._16_8_ = (UChar *)0x0;
        local_b0._24_5_ = 0;
        local_b0._29_3_ = 0;
        local_b0._32_5_ = 0;
        local_b0._37_8_ = 0;
        iVar1 = icu_63::ReorderingBuffer::init
                          ((ReorderingBuffer *)local_b0,(EVP_PKEY_CTX *)(ulong)(uint)length);
        if ((char)iVar1 != '\0') {
          pUVar4 = (UChar *)0x0;
          if (-1 < length) {
            pUVar4 = src + (uint)length;
          }
          (**(code **)(*plVar3 + 0x90))(plVar3,src,pUVar4,local_b0,pErrorCode);
        }
        icu_63::ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_b0);
      }
    }
    local_e0.p_ = dest;
    iVar2 = icu_63::UnicodeString::extract(&local_70,&local_e0,capacity,pErrorCode);
    local_d0 = local_e0.p_;
    icu_63::UnicodeString::~UnicodeString(&local_70);
    return iVar2;
  }
LAB_002a33d3:
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_normalize(const UNormalizer2 *norm2,
                 const UChar *src, int32_t length,
                 UChar *dest, int32_t capacity,
                 UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if( (src==NULL ? length!=0 : length<-1) ||
        (dest==NULL ? capacity!=0 : capacity<0) ||
        (src==dest && src!=NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString destString(dest, 0, capacity);
    // length==0: Nothing to do, and n2wi->normalize(NULL, NULL, buffer, ...) would crash.
    if(length!=0) {
        const Normalizer2 *n2=(const Normalizer2 *)norm2;
        const Normalizer2WithImpl *n2wi=dynamic_cast<const Normalizer2WithImpl *>(n2);
        if(n2wi!=NULL) {
            // Avoid duplicate argument checking and support NUL-terminated src.
            ReorderingBuffer buffer(n2wi->impl, destString);
            if(buffer.init(length, *pErrorCode)) {
                n2wi->normalize(src, length>=0 ? src+length : NULL, buffer, *pErrorCode);
            }
        } else {
            UnicodeString srcString(length<0, src, length);
            n2->normalize(srcString, destString, *pErrorCode);
        }
    }
    return destString.extract(dest, capacity, *pErrorCode);
}